

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
          (ModuleDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ModuleHeaderSyntax *header,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endmodule,
          NamedBlockClauseSyntax *blockName)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  long lVar6;
  
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = kind;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->header).ptr = header;
  SVar4 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed010;
  (this->endmodule).kind = endmodule.kind;
  (this->endmodule).field_0x2 = endmodule._2_1_;
  (this->endmodule).numFlags = (NumericTokenFlags)endmodule.numFlags.raw;
  (this->endmodule).rawLen = endmodule.rawLen;
  (this->endmodule).info = endmodule.info;
  this->blockName = blockName;
  (header->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  if (blockName != (NamedBlockClauseSyntax *)0x0) {
    (blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ModuleDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, ModuleHeaderSyntax& header, const SyntaxList<MemberSyntax>& members, Token endmodule, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(kind, attributes), header(&header), members(members), endmodule(endmodule), blockName(blockName) {
        this->header->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }